

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

from_chars_result __thiscall
semver::detail::version_parser::parse_number<long>(version_parser *this,long *out)

{
  bool bVar1;
  byte *pbVar2;
  char *pcVar3;
  char *extraout_RDX;
  undefined8 uVar4;
  pointer ptVar5;
  ulong uVar6;
  from_chars_result fVar7;
  token token;
  
  ptVar5 = &token;
  token._0_8_ = token_stream::advance(this->stream);
  if ((char)token._0_8_ != '\x06') {
    uVar4 = 0x16;
    pcVar3 = extraout_RDX;
    goto LAB_00103abe;
  }
  pbVar2 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                     (&token.value);
  uVar6 = (ulong)*pbVar2;
  if (uVar6 == 0) {
LAB_00103a96:
    *out = uVar6;
    ptVar5 = (this->stream->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start + this->stream->current;
    uVar4 = 0;
  }
  else {
    while (bVar1 = token_stream::advanceIfMatch(this->stream,&token,digit), bVar1) {
      pbVar2 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         (&token.value);
      uVar6 = (ulong)*pbVar2 + uVar6 * 10;
    }
    if (-1 < (long)uVar6) goto LAB_00103a96;
    uVar4 = 0x22;
  }
  pcVar3 = ptVar5->lexeme;
LAB_00103abe:
  fVar7.super_from_chars_result._8_8_ = uVar4;
  fVar7.super_from_chars_result.ptr = pcVar3;
  return (from_chars_result)fVar7.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse_number(Int& out) {
    token token = stream.advance();

    if (!is_digit(token)) {
      return failure(token.lexeme);
    }

    const auto first_digit = std::get<std::uint8_t>(token.value);
    std::uint64_t result = first_digit;

    if (first_digit == 0) {
      out = static_cast<Int>(result);
      return success(stream.peek().lexeme);
    }

    while (stream.advanceIfMatch(token, token_type::digit)) {
      result = result * 10 + std::get<std::uint8_t>(token.value);
    }

    if (detail::number_in_range<Int>(result)) {
      out = static_cast<Int>(result);
      return success(stream.peek().lexeme);
    }

    return failure(token.lexeme, std::errc::result_out_of_range);
  }